

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall
CommandLineArguments::setPackageName(CommandLineArguments *this,int ac,char **av,int *i)

{
  size_t sVar1;
  int ac_00;
  SimpleString packageName;
  undefined1 auStack_48 [32];
  
  ac_00 = 0x2c2133;
  SimpleString::SimpleString((SimpleString *)(auStack_48 + 0x10),"-k");
  getParameterField((CommandLineArguments *)auStack_48,ac_00,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString((SimpleString *)(auStack_48 + 0x10));
  sVar1 = SimpleString::size((SimpleString *)auStack_48);
  if (sVar1 != 0) {
    SimpleString::operator=(&this->packageName_,(SimpleString *)auStack_48);
  }
  SimpleString::~SimpleString((SimpleString *)auStack_48);
  return;
}

Assistant:

void CommandLineArguments::setPackageName(int ac, const char *const *av, int& i)
{
    SimpleString packageName = getParameterField(ac, av, i, "-k");
    if (packageName.size() == 0) return;

    packageName_ = packageName;
}